

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O1

void check_call(wasm_func_t *func,int32_t arg1,int32_t arg2,int32_t expected)

{
  long lVar1;
  wasm_val_t results [1];
  wasm_val_t args [2];
  undefined1 auStack_38 [8];
  int local_30;
  undefined1 local_28 [8];
  int32_t local_20;
  undefined1 local_18;
  int32_t local_10;
  
  local_28[0] = 0;
  local_18 = 0;
  local_20 = arg1;
  local_10 = arg2;
  lVar1 = wasm_func_call(func,local_28,auStack_38);
  if ((lVar1 == 0) && (local_30 == expected)) {
    return;
  }
  puts("> Error on result");
  exit(1);
}

Assistant:

void check_call(wasm_func_t* func, int32_t arg1, int32_t arg2, int32_t expected) {
  wasm_val_t args[2] = {
    {.kind = WASM_I32, .of = {.i32 = arg1}},
    {.kind = WASM_I32, .of = {.i32 = arg2}}
  };
  wasm_val_t results[1];
  if (wasm_func_call(func, args, results) || results[0].of.i32 != expected) {
    printf("> Error on result\n");
    exit(1);
  }
}